

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# api.c
# Opt level: O0

int yaml_string_join(yaml_char_t **a_start,yaml_char_t **a_pointer,yaml_char_t **a_end,
                    yaml_char_t **b_start,yaml_char_t **b_pointer,yaml_char_t **b_end)

{
  int iVar1;
  yaml_char_t **b_end_local;
  yaml_char_t **b_pointer_local;
  yaml_char_t **b_start_local;
  yaml_char_t **a_end_local;
  yaml_char_t **a_pointer_local;
  yaml_char_t **a_start_local;
  
  if (*b_start == *b_pointer) {
    a_start_local._4_4_ = 1;
  }
  else {
    do {
      if ((long)*b_pointer - (long)*b_start < (long)*a_end - (long)*a_pointer) {
        memcpy(*a_pointer,*b_start,(long)*b_pointer - (long)*b_start);
        *a_pointer = *a_pointer + ((long)*b_pointer - (long)*b_start);
        return 1;
      }
      iVar1 = yaml_string_extend(a_start,a_pointer,a_end);
    } while (iVar1 != 0);
    a_start_local._4_4_ = 0;
  }
  return a_start_local._4_4_;
}

Assistant:

YAML_DECLARE(int)
yaml_string_join(
        yaml_char_t **a_start, yaml_char_t **a_pointer, yaml_char_t **a_end,
        yaml_char_t **b_start, yaml_char_t **b_pointer, SHIM(yaml_char_t **b_end))
{
    UNUSED_PARAM(b_end)
    if (*b_start == *b_pointer)
        return 1;

    while (*a_end - *a_pointer <= *b_pointer - *b_start) {
        if (!yaml_string_extend(a_start, a_pointer, a_end))
            return 0;
    }

    memcpy(*a_pointer, *b_start, *b_pointer - *b_start);
    *a_pointer += *b_pointer - *b_start;

    return 1;
}